

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-rbtree.c
# Opt level: O0

int val_cmp(RBTREE_NODE *node1,RBTREE_NODE *node2)

{
  VAL *val2;
  VAL *val1;
  RBTREE_NODE *node2_local;
  RBTREE_NODE *node1_local;
  int local_4;
  
  if (*(int *)&node1[-1].r < *(int *)&node2[-1].r) {
    local_4 = -1;
  }
  else if (*(int *)&node2[-1].r < *(int *)&node1[-1].r) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
val_cmp(const RBTREE_NODE* node1, const RBTREE_NODE* node2)
{
    const VAL* val1 = RBTREE_DATA(node1, VAL, the_node);
    const VAL* val2 = RBTREE_DATA(node2, VAL, the_node);

    if(val1->x < val2->x)
        return -1;
    if(val1->x > val2->x)
        return +1;
    return 0;
}